

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O0

void rw::collectFaces(Geometry *geo,StripMesh *sm,uint16 m)

{
  int iVar1;
  Triangle *pTVar2;
  StripNode *pSVar3;
  uint uVar4;
  int local_34;
  int32 i;
  Triangle *t;
  StripNode *n;
  uint16 m_local;
  StripMesh *sm_local;
  Geometry *geo_local;
  
  sm->numNodes = 0;
  for (local_34 = 0; local_34 < geo->numTriangles; local_34 = local_34 + 1) {
    pTVar2 = geo->triangles + local_34;
    if (pTVar2->matId == m) {
      iVar1 = sm->numNodes;
      uVar4 = iVar1 + 1;
      sm->numNodes = uVar4;
      pSVar3 = sm->nodes + iVar1;
      pSVar3->v[0] = pTVar2->v[0];
      pSVar3->v[1] = pTVar2->v[1];
      pSVar3->v[2] = pTVar2->v[2];
      pSVar3->e[0].node = 0;
      pSVar3->e[1].node = 0;
      pSVar3->e[2].node = 0;
      pSVar3->e[0].field_0x4 = pSVar3->e[0].field_0x4 & 0xfe;
      pSVar3->e[1].field_0x4 = pSVar3->e[1].field_0x4 & 0xfe;
      pSVar3->e[2].field_0x4 = pSVar3->e[2].field_0x4 & 0xfe;
      pSVar3->e[0].field_0x4 = pSVar3->e[0].field_0x4 & 0xf7;
      pSVar3->e[1].field_0x4 = pSVar3->e[1].field_0x4 & 0xf7;
      pSVar3->e[2].field_0x4 = pSVar3->e[2].field_0x4 & 0xf7;
      pSVar3->field_0x6 = pSVar3->field_0x6 & 0xfc;
      pSVar3->field_0x6 = pSVar3->field_0x6 & 0xfb;
      pSVar3->field_0x6 = pSVar3->field_0x6 & 0xf7;
      pSVar3->field_0x6 = pSVar3->field_0x6 & 0xef;
      pSVar3->stripId = -1;
      LLLink::init(&pSVar3->inlist,(EVP_PKEY_CTX *)(ulong)uVar4);
    }
  }
  return;
}

Assistant:

static void
collectFaces(Geometry *geo, StripMesh *sm, uint16 m)
{
	StripNode *n;
	Triangle *t;
	sm->numNodes = 0;
	for(int32 i = 0; i < geo->numTriangles; i++){
		t = &geo->triangles[i];
		if(t->matId == m){
			n = &sm->nodes[sm->numNodes++];
			n->v[0] = t->v[0];
			n->v[1] = t->v[1];
			n->v[2] = t->v[2];
			assert(t->v[0] < geo->numVertices);
			assert(t->v[1] < geo->numVertices);
			assert(t->v[2] < geo->numVertices);
			n->e[0].node = 0;
			n->e[1].node = 0;
			n->e[2].node = 0;
			n->e[0].isConnected = 0;
			n->e[1].isConnected = 0;
			n->e[2].isConnected = 0;
			n->e[0].isStrip = 0;
			n->e[1].isStrip = 0;
			n->e[2].isStrip = 0;
			n->parent = 0;
			n->visited = 0;
			n->stripVisited = 0;
			n->isEnd = 0;
			n->stripId = -1;
			n->inlist.init();
		}
	}
}